

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::tree_node<char,_false>_> __thiscall
immutable::rrb_details::rrb_drop_right_rec<char,false,5>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<char,_false>_> *root,uint32_t right,uint32_t shift,
          bool has_left)

{
  char cVar1;
  ref<immutable::rrb_details::internal_node<char,_false>_> *prVar2;
  internal_node<char,_false> *piVar3;
  rrb_size_table<false> *prVar4;
  rrb_size_table<false> *prVar5;
  leaf_node<char,_false> *plVar6;
  uint local_dc;
  uint32_t i_2;
  ref<immutable::rrb_details::leaf_node<char,_false>_> left_vals;
  ref<immutable::rrb_details::leaf_node<char,_false>_> leaf_root;
  uint32_t i_1;
  ref<immutable::rrb_details::rrb_size_table<false>_> sliced_table;
  ref<immutable::rrb_details::internal_node<char,_false>_> sliced_root_1;
  ref<immutable::rrb_details::rrb_size_table<false>_> right_hand_table;
  ref<immutable::rrb_details::internal_node<char,_false>_> right_hand_parent_1;
  ref<immutable::rrb_details::tree_node<char,_false>_> right_hand_node_1;
  ref<immutable::rrb_details::tree_node<char,_false>_> internal_root_child;
  uint32_t idx;
  rrb_size_table<false> *table;
  uint32_t i;
  ref<immutable::rrb_details::internal_node<char,_false>_> sliced_root;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_68;
  ref<immutable::rrb_details::internal_node<char,_false>_> right_hand_parent;
  ref<immutable::rrb_details::tree_node<char,_false>_> right_hand_node;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_48;
  ref<immutable::rrb_details::tree_node<char,_false>_> child;
  ref<immutable::rrb_details::internal_node<char,_false>_> internal_root;
  uint32_t subidx;
  uint32_t subshift;
  bool has_left_local;
  uint32_t shift_local;
  uint32_t right_local;
  ref<immutable::rrb_details::tree_node<char,_false>_> *root_local;
  uint32_t *total_shift_local;
  
  internal_root.ptr._4_4_ = right >> ((byte)shift & 0x1f);
  if (shift == 0) {
    ref<immutable::rrb_details::leaf_node<char,false>>::
    ref<immutable::rrb_details::tree_node<char,false>>
              ((ref<immutable::rrb_details::leaf_node<char,false>> *)&left_vals,root);
    plVar6 = leaf_node_create<char,false>(internal_root.ptr._4_4_ + 1);
    ref<immutable::rrb_details::leaf_node<char,_false>_>::ref
              ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&stack0xffffffffffffff28,
               plVar6);
    for (local_dc = 0; local_dc < internal_root.ptr._4_4_ + 1; local_dc = local_dc + 1) {
      plVar6 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&left_vals);
      cVar1 = plVar6->child[local_dc];
      plVar6 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)
                          &stack0xffffffffffffff28);
      plVar6->child[local_dc] = cVar1;
    }
    *total_shift = 0;
    ref<immutable::rrb_details::tree_node<char,false>>::
    ref<immutable::rrb_details::leaf_node<char,false>>
              ((ref<immutable::rrb_details::tree_node<char,false>> *)this,
               (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&stack0xffffffffffffff28);
    sliced_root.ptr._4_4_ = 1;
    ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref
              ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&stack0xffffffffffffff28);
    ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref(&left_vals);
  }
  else {
    ref<immutable::rrb_details::internal_node<char,false>>::
    ref<immutable::rrb_details::tree_node<char,false>>
              ((ref<immutable::rrb_details::internal_node<char,false>> *)&child,root);
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child);
    if ((piVar3->size_table).ptr == (rrb_size_table<false> *)0x0) {
      piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child);
      ref<immutable::rrb_details::tree_node<char,false>>::
      ref<immutable::rrb_details::internal_node<char,false>>
                ((ref<immutable::rrb_details::tree_node<char,false>> *)&local_48,
                 piVar3->child + internal_root.ptr._4_4_);
      rrb_drop_right_rec<char,false,5>
                ((rrb_details *)&right_hand_parent,total_shift,&local_48,
                 right - (internal_root.ptr._4_4_ << ((byte)shift & 0x1f)),shift - 5,
                 internal_root.ptr._4_4_ != 0 || has_left);
      if (internal_root.ptr._4_4_ == 0) {
        if (has_left) {
          piVar3 = internal_node_create<char,false>(1);
          ref<immutable::rrb_details::internal_node<char,_false>_>::ref(&local_68,piVar3);
          piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_68);
          ref<immutable::rrb_details::internal_node<char,false>>::operator=
                    ((ref<immutable::rrb_details::internal_node<char,false>> *)piVar3->child,
                     (ref<immutable::rrb_details::tree_node<char,_false>_> *)&right_hand_parent);
          *total_shift = shift;
          ref<immutable::rrb_details::tree_node<char,false>>::
          ref<immutable::rrb_details::internal_node<char,false>>
                    ((ref<immutable::rrb_details::tree_node<char,false>> *)this,&local_68);
          sliced_root.ptr._4_4_ = 1;
          ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_68);
        }
        else {
          ref<immutable::rrb_details::tree_node<char,_false>_>::ref
                    ((ref<immutable::rrb_details::tree_node<char,_false>_> *)this,
                     (ref<immutable::rrb_details::tree_node<char,_false>_> *)&right_hand_parent);
          sliced_root.ptr._4_4_ = 1;
        }
      }
      else {
        piVar3 = internal_node_create<char,false>(internal_root.ptr._4_4_ + 1);
        ref<immutable::rrb_details::internal_node<char,_false>_>::ref
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   &stack0xffffffffffffff88,piVar3);
        for (table._4_4_ = 0; table._4_4_ < internal_root.ptr._4_4_; table._4_4_ = table._4_4_ + 1)
        {
          piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child);
          prVar2 = piVar3->child;
          piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                              &stack0xffffffffffffff88);
          ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                    (piVar3->child + table._4_4_,prVar2 + table._4_4_);
        }
        piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                            &stack0xffffffffffffff88);
        ref<immutable::rrb_details::internal_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,false>> *)
                   (piVar3->child + internal_root.ptr._4_4_),
                   (ref<immutable::rrb_details::tree_node<char,_false>_> *)&right_hand_parent);
        *total_shift = shift;
        ref<immutable::rrb_details::tree_node<char,false>>::
        ref<immutable::rrb_details::internal_node<char,false>>
                  ((ref<immutable::rrb_details::tree_node<char,false>> *)this,
                   (ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   &stack0xffffffffffffff88);
        sliced_root.ptr._4_4_ = 1;
        ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   &stack0xffffffffffffff88);
      }
      ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&right_hand_parent);
      ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_48);
    }
    else {
      piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child);
      prVar4 = (piVar3->size_table).ptr;
      for (; prVar4->size[internal_root.ptr._4_4_] <= right;
          internal_root.ptr._4_4_ = internal_root.ptr._4_4_ + 1) {
      }
      internal_root_child.ptr._4_4_ = right;
      if (internal_root.ptr._4_4_ != 0) {
        internal_root_child.ptr._4_4_ = right - prVar4->size[internal_root.ptr._4_4_ - 1];
      }
      piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child);
      ref<immutable::rrb_details::tree_node<char,false>>::
      ref<immutable::rrb_details::internal_node<char,false>>
                ((ref<immutable::rrb_details::tree_node<char,false>> *)&right_hand_node_1,
                 piVar3->child + internal_root.ptr._4_4_);
      rrb_drop_right_rec<char,false,5>
                ((rrb_details *)&right_hand_parent_1,total_shift,&right_hand_node_1,
                 internal_root_child.ptr._4_4_,shift - 5,internal_root.ptr._4_4_ != 0 || has_left);
      if (internal_root.ptr._4_4_ == 0) {
        if (has_left) {
          piVar3 = internal_node_create<char,false>(1);
          ref<immutable::rrb_details::internal_node<char,_false>_>::ref
                    ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&right_hand_table,
                     piVar3);
          prVar4 = size_table_create<false>(1);
          ref<immutable::rrb_details::rrb_size_table<false>_>::ref
                    ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&sliced_root_1,prVar4);
          prVar4 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                             ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&sliced_root_1)
          ;
          *prVar4->size = right + 1;
          piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                              &right_hand_table);
          ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                    (&piVar3->size_table,
                     (ref<immutable::rrb_details::rrb_size_table<false>_> *)&sliced_root_1);
          piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                              &right_hand_table);
          ref<immutable::rrb_details::internal_node<char,false>>::operator=
                    ((ref<immutable::rrb_details::internal_node<char,false>> *)piVar3->child,
                     (ref<immutable::rrb_details::tree_node<char,_false>_> *)&right_hand_parent_1);
          *total_shift = shift;
          ref<immutable::rrb_details::tree_node<char,false>>::
          ref<immutable::rrb_details::internal_node<char,false>>
                    ((ref<immutable::rrb_details::tree_node<char,false>> *)this,
                     (ref<immutable::rrb_details::internal_node<char,_false>_> *)&right_hand_table);
          sliced_root.ptr._4_4_ = 1;
          ref<immutable::rrb_details::rrb_size_table<false>_>::~ref
                    ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&sliced_root_1);
          ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
                    ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&right_hand_table);
        }
        else {
          ref<immutable::rrb_details::tree_node<char,_false>_>::ref
                    ((ref<immutable::rrb_details::tree_node<char,_false>_> *)this,
                     (ref<immutable::rrb_details::tree_node<char,_false>_> *)&right_hand_parent_1);
          sliced_root.ptr._4_4_ = 1;
        }
      }
      else {
        piVar3 = internal_node_create<char,false>(internal_root.ptr._4_4_ + 1);
        ref<immutable::rrb_details::internal_node<char,_false>_>::ref
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&sliced_table,piVar3)
        ;
        prVar5 = size_table_create<false>(internal_root.ptr._4_4_ + 1);
        ref<immutable::rrb_details::rrb_size_table<false>_>::ref
                  ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&stack0xffffffffffffff40,
                   prVar5);
        prVar5 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                           ((ref<immutable::rrb_details::rrb_size_table<false>_> *)
                            &stack0xffffffffffffff40);
        memcpy(prVar5->size,prVar4->size,(ulong)internal_root.ptr._4_4_ << 2);
        prVar4 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                           ((ref<immutable::rrb_details::rrb_size_table<false>_> *)
                            &stack0xffffffffffffff40);
        prVar4->size[internal_root.ptr._4_4_] = right + 1;
        for (leaf_root.ptr._4_4_ = 0; leaf_root.ptr._4_4_ < internal_root.ptr._4_4_;
            leaf_root.ptr._4_4_ = leaf_root.ptr._4_4_ + 1) {
          piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child);
          prVar2 = piVar3->child;
          piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                              &sliced_table);
          ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                    (piVar3->child + leaf_root.ptr._4_4_,prVar2 + leaf_root.ptr._4_4_);
        }
        piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                            &sliced_table);
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar3->size_table,
                   (ref<immutable::rrb_details::rrb_size_table<false>_> *)&stack0xffffffffffffff40);
        piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                            &sliced_table);
        ref<immutable::rrb_details::internal_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,false>> *)
                   (piVar3->child + internal_root.ptr._4_4_),
                   (ref<immutable::rrb_details::tree_node<char,_false>_> *)&right_hand_parent_1);
        *total_shift = shift;
        ref<immutable::rrb_details::tree_node<char,false>>::
        ref<immutable::rrb_details::internal_node<char,false>>
                  ((ref<immutable::rrb_details::tree_node<char,false>> *)this,
                   (ref<immutable::rrb_details::internal_node<char,_false>_> *)&sliced_table);
        sliced_root.ptr._4_4_ = 1;
        ref<immutable::rrb_details::rrb_size_table<false>_>::~ref
                  ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&stack0xffffffffffffff40);
        ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&sliced_table);
      }
      ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&right_hand_parent_1);
      ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&right_hand_node_1);
    }
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child);
  }
  return (ref<immutable::rrb_details::tree_node<char,_false>_>)(tree_node<char,_false> *)this;
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_right_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t right, uint32_t shift, bool has_left)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = right >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        if (internal_root->size_table.ptr == nullptr)
          {
          ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
          ref<tree_node<T, atomic_ref_counting>> right_hand_node = rrb_drop_right_rec<T, atomic_ref_counting, N>(total_shift, child, right - (subidx << shift), subshift, (subidx != 0) | has_left);
          if (subidx == 0)
            {
            if (has_left)
              {
              ref<internal_node<T, atomic_ref_counting>> right_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
              right_hand_parent->child[0] = right_hand_node;
              *total_shift = shift;
              return right_hand_parent;
              }
            else { // if (!has_left)
              return right_hand_node;
              }
            }
          else
            { // if (subidx != 0)
            ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(subidx + 1);
            for (uint32_t i = 0; i < subidx; ++i)
              sliced_root->child[i] = internal_root->child[i];
            sliced_root->child[subidx] = right_hand_node;
            *total_shift = shift;
            return sliced_root;
            }
          }
        else
          { // if (internal_root->size_table != NULL)
          rrb_size_table<atomic_ref_counting>* table = internal_root->size_table.ptr;
          uint32_t idx = right;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }

          ref<tree_node<T, atomic_ref_counting>> internal_root_child = internal_root->child[subidx];
          ref<tree_node<T, atomic_ref_counting>> right_hand_node = rrb_drop_right_rec<T, atomic_ref_counting, N>(total_shift, internal_root_child, idx, subshift, (subidx != 0) | has_left);
          if (subidx == 0)
            {
            if (has_left)
              {
              // As there is one above us, must place the right hand node in a
              // one-node
              ref<internal_node<T, atomic_ref_counting>> right_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
              ref<rrb_size_table<atomic_ref_counting>> right_hand_table = size_table_create<atomic_ref_counting>(1);

              right_hand_table->size[0] = right + 1;
              // TODO: Not set size_table if the underlying node doesn't have a
              // table as well.
              right_hand_parent->size_table = right_hand_table;
              right_hand_parent->child[0] = right_hand_node;

              *total_shift = shift;
              return right_hand_parent;
              }
            else
              { // if (!has_left)
              return right_hand_node;
              }
            }
          else
            { // if (subidx != 0)
            ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(subidx + 1);
            ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(subidx + 1);

            memcpy(sliced_table->size, table->size, subidx * sizeof(uint32_t));
            sliced_table->size[subidx] = right + 1;

            for (uint32_t i = 0; i < subidx; ++i)
              sliced_root->child[i] = internal_root->child[i];
            sliced_root->size_table = sliced_table;
            sliced_root->child[subidx] = right_hand_node;

            *total_shift = shift;
            return sliced_root;
            }
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        // Just pure copying into a new node
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        ref<leaf_node<T, atomic_ref_counting>> left_vals = leaf_node_create<T, atomic_ref_counting>(subidx + 1);

        //memcpy(left_vals->child, leaf_root->child, (subidx + 1) * sizeof(T));
        for (uint32_t i = 0; i < subidx + 1; ++i)
          left_vals->child[i] = leaf_root->child[i]; // don't memcpy, but use copy constructor

        *total_shift = shift;
        return left_vals;
        }
      }